

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

QModelIndex * __thiscall
QTreeView::indexAbove(QModelIndex *__return_storage_ptr__,QTreeView *this,QModelIndex *index)

{
  long lVar1;
  QTreeViewPrivate *this_00;
  QTreeViewItem *pQVar2;
  QAbstractItemModel *pQVar3;
  quintptr qVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < index->r) && (-1 < index->c)) &&
     (this_00 = *(QTreeViewPrivate **)
                 &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                  super_QWidget.field_0x8,
     (index->m).ptr == (this_00->super_QAbstractItemViewPrivate).model)) {
    if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
       ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
      QAbstractItemViewPrivate::interruptDelayedItemsLayout
                (&this_00->super_QAbstractItemViewPrivate);
      (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8 + 0x220))();
    }
    uVar7 = QTreeViewPrivate::viewIndex(this_00,index);
    if (0 < (int)uVar7) {
      pQVar2 = (this_00->viewItems).d.ptr;
      pQVar3 = pQVar2[(ulong)uVar7 - 1].index.m.ptr;
      if (pQVar3 != (QAbstractItemModel *)0x0) {
        if (pQVar2[(ulong)uVar7 - 1].index.c == index->c) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            iVar5 = pQVar2[(ulong)uVar7 - 1].index.r;
            iVar6 = pQVar2[(ulong)uVar7 - 1].index.c;
            qVar4 = pQVar2[(ulong)uVar7 - 1].index.i;
            (__return_storage_ptr__->m).ptr = pQVar2[(ulong)uVar7 - 1].index.m.ptr;
            __return_storage_ptr__->r = iVar5;
            __return_storage_ptr__->c = iVar6;
            __return_storage_ptr__->i = qVar4;
            return __return_storage_ptr__;
          }
        }
        else {
          (**(code **)(*(long *)pQVar3 + 0x70))
                    (__return_storage_ptr__,pQVar3,pQVar2[(ulong)uVar7 - 1].index.r);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return __return_storage_ptr__;
          }
        }
        goto LAB_005b0121;
      }
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
    return __return_storage_ptr__;
  }
LAB_005b0121:
  __stack_chk_fail();
}

Assistant:

QModelIndex QTreeView::indexAbove(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    if (!d->isIndexValid(index))
        return QModelIndex();
    d->executePostedLayout();
    int i = d->viewIndex(index);
    if (--i < 0)
        return QModelIndex();
    const QModelIndex firstColumnIndex = d->viewItems.at(i).index;
    return firstColumnIndex.sibling(firstColumnIndex.row(), index.column());
}